

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lysc_check_status(lysc_ctx *ctx,uint16_t flags1,void *mod1,char *name1,uint16_t flags2,
                        void *mod2,char *name2)

{
  LY_ERR LVar1;
  ushort uVar2;
  ushort uVar3;
  char *pcVar4;
  char *pcVar5;
  
  uVar2 = flags1 & 0x1c;
  if ((flags1 & 0x1c) == 0) {
    uVar2 = 4;
  }
  uVar3 = flags2 & 0x1c;
  if ((flags2 & 0x1c) == 0) {
    uVar3 = 4;
  }
  LVar1 = LY_SUCCESS;
  if ((mod1 == mod2 && uVar2 < uVar3) && (LVar1 = LY_EVALID, ctx != (lysc_ctx *)0x0)) {
    pcVar4 = "current";
    if (uVar2 != 4) {
      pcVar4 = "deprecated";
    }
    pcVar5 = "obsolete";
    if (uVar3 != 0x10) {
      pcVar5 = "deprecated";
    }
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
            "A %s definition \"%s\" is not allowed to reference %s definition \"%s\".",pcVar4,name1,
            pcVar5,name2);
  }
  return LVar1;
}

Assistant:

LY_ERR
lysc_check_status(struct lysc_ctx *ctx, uint16_t flags1, void *mod1, const char *name1, uint16_t flags2, void *mod2,
        const char *name2)
{
    uint16_t flg1, flg2;

    flg1 = (flags1 & LYS_STATUS_MASK) ? (flags1 & LYS_STATUS_MASK) : LYS_STATUS_CURR;
    flg2 = (flags2 & LYS_STATUS_MASK) ? (flags2 & LYS_STATUS_MASK) : LYS_STATUS_CURR;

    if ((flg1 < flg2) && (mod1 == mod2)) {
        if (ctx) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "A %s definition \"%s\" is not allowed to reference %s definition \"%s\".",
                    flg1 == LYS_STATUS_CURR ? "current" : "deprecated", name1,
                    flg2 == LYS_STATUS_OBSLT ? "obsolete" : "deprecated", name2);
        }
        return LY_EVALID;
    }

    return LY_SUCCESS;
}